

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::write_byte_string(basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,byte_string_view *b)

{
  ulong uVar1;
  size_t sVar2;
  uint8_t *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint8_t buf [1];
  byte *__args;
  container_type *this_01;
  size_t sVar4;
  uint8_t local_2f;
  byte local_2e;
  uchar local_2d;
  byte local_2c [4];
  
  uVar1 = b->size_;
  if (uVar1 < 0x18) {
    local_2e = (byte)uVar1 | 0x40;
    this_01 = (this->sink_).buf_ptr;
    __args = &local_2e;
  }
  else {
    if (0xff < uVar1) {
      if (uVar1 < 0x10000) {
        local_2c[1] = 0x59;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((this->sink_).buf_ptr,local_2c + 1);
        binary::
        native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                  ((unsigned_short)b->size_,
                   (back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    )&this->sink_);
      }
      else {
        this_00 = (this->sink_).buf_ptr;
        if (uVar1 >> 0x20 == 0) {
          local_2c[2] = 0x5a;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this_00,(uchar *)((long)local_2c + 2));
          binary::
          native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    ((uint)b->size_,
                     (back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      )&this->sink_);
        }
        else {
          local_2c[3] = 0x5b;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this_00,(uchar *)((long)local_2c + 3));
          binary::
          native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    (b->size_,(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               )&this->sink_);
        }
      }
      goto LAB_00276b63;
    }
    local_2d = 'X';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((this->sink_).buf_ptr,&local_2d);
    local_2c[0] = (byte)b->size_;
    this_01 = (this->sink_).buf_ptr;
    __args = local_2c;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_01,__args);
LAB_00276b63:
  sVar2 = b->size_;
  if (sVar2 != 0) {
    puVar3 = b->data_;
    sVar4 = 0;
    do {
      local_2f = puVar3[sVar4];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((this->sink_).buf_ptr,&local_2f);
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return;
}

Assistant:

void write_byte_string(const byte_string_view& b) 
    {
        if (b.size() <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x40 + b.size()), 
                                            std::back_inserter(sink_));
        }
        else if (b.size() <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x58), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(b.size()), 
                                            std::back_inserter(sink_));
        }
        else if (b.size() <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x59), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(b.size()), 
                                            std::back_inserter(sink_));
        }
        else if (b.size() <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x5a), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(b.size()), 
                                            std::back_inserter(sink_));
        }
        else // if (b.size() <= 0xffffffffffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x5b), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(b.size()), 
                                            std::back_inserter(sink_));
        }

        for (auto c : b)
        {
            sink_.push_back(c);
        }
    }